

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_fractional.c
# Opt level: O0

void WebRtcSpl_Resample48khzTo32khz(int32_t *In,int32_t *Out,size_t K)

{
  ulong local_30;
  size_t m;
  int32_t tmp;
  size_t K_local;
  int32_t *Out_local;
  int32_t *In_local;
  
  K_local = (size_t)Out;
  Out_local = In;
  for (local_30 = 0; local_30 < K; local_30 = local_30 + 1) {
    *(int32_t *)K_local =
         Out_local[7] * 0xde +
         Out_local[6] * 0x1b9 +
         Out_local[5] * -0xec7 +
         Out_local[4] * 0x3267 +
         Out_local[3] * 0x5af5 +
         Out_local[2] * 0x43f + Out_local[1] * -0x802 + *Out_local * 0x30a + 0x4000;
    *(int32_t *)(K_local + 4) =
         Out_local[8] * 0x30a +
         Out_local[7] * -0x802 +
         Out_local[6] * 0x43f +
         Out_local[5] * 0x5af5 +
         Out_local[4] * 0x3267 +
         Out_local[3] * -0xec7 + Out_local[2] * 0x1b9 + Out_local[1] * 0xde + 0x4000;
    Out_local = Out_local + 3;
    K_local = K_local + 8;
  }
  return;
}

Assistant:

void WebRtcSpl_Resample48khzTo32khz(const int32_t *In, int32_t *Out, size_t K)
{
    /////////////////////////////////////////////////////////////
    // Filter operation:
    //
    // Perform resampling (3 input samples -> 2 output samples);
    // process in sub blocks of size 3 samples.
    int32_t tmp;
    size_t m;

    for (m = 0; m < K; m++)
    {
        tmp = 1 << 14;
        tmp += kCoefficients48To32[0][0] * In[0];
        tmp += kCoefficients48To32[0][1] * In[1];
        tmp += kCoefficients48To32[0][2] * In[2];
        tmp += kCoefficients48To32[0][3] * In[3];
        tmp += kCoefficients48To32[0][4] * In[4];
        tmp += kCoefficients48To32[0][5] * In[5];
        tmp += kCoefficients48To32[0][6] * In[6];
        tmp += kCoefficients48To32[0][7] * In[7];
        Out[0] = tmp;

        tmp = 1 << 14;
        tmp += kCoefficients48To32[1][0] * In[1];
        tmp += kCoefficients48To32[1][1] * In[2];
        tmp += kCoefficients48To32[1][2] * In[3];
        tmp += kCoefficients48To32[1][3] * In[4];
        tmp += kCoefficients48To32[1][4] * In[5];
        tmp += kCoefficients48To32[1][5] * In[6];
        tmp += kCoefficients48To32[1][6] * In[7];
        tmp += kCoefficients48To32[1][7] * In[8];
        Out[1] = tmp;

        // update pointers
        In += 3;
        Out += 2;
    }
}